

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O2

ON_Font * ON_Font::GetManagedFontFromPostScriptName(wchar_t *postscript_name)

{
  wchar_t *postscript_name_00;
  ON_Font *pOVar1;
  ON_wString buffer;
  ON_Font font;
  
  ON_wString::ON_wString(&buffer,postscript_name);
  ON_wString::TrimLeftAndRight(&buffer,(wchar_t *)0x0);
  postscript_name_00 = ON_wString::operator_cast_to_wchar_t_(&buffer);
  pOVar1 = &Default;
  if ((postscript_name_00 != (wchar_t *)0x0) && (*postscript_name_00 != L'\0')) {
    pOVar1 = ON_FontList::FromPostScriptName
                       (&ON_ManagedFonts::List.m_managed_fonts,postscript_name_00);
    if (pOVar1 == (ON_Font *)0x0) {
      ON_ManagedFonts::InstalledFonts();
      pOVar1 = ON_FontList::FromPostScriptName
                         (&ON_ManagedFonts::List.m_installed_fonts,postscript_name_00);
      if (pOVar1 == (ON_Font *)0x0) {
        ON_Font(&font,&Unset);
        SetFontWeight(&font,Normal);
        SetFontStretch(&font,Medium);
        SetFontStyle(&font,Upright);
        ON_wString::operator=(&font.m_loc_postscript_name,postscript_name_00);
        ON_wString::operator=(&font.m_en_postscript_name,&font.m_loc_postscript_name);
        pOVar1 = ManagedFont(&font);
        ~ON_Font(&font);
      }
      else {
        pOVar1 = ManagedFont(pOVar1);
      }
    }
  }
  ON_wString::~ON_wString(&buffer);
  return pOVar1;
}

Assistant:

const ON_Font* ON_Font::GetManagedFontFromPostScriptName(
  const wchar_t* postscript_name
  )
{
  ON_wString buffer(postscript_name);
  buffer.TrimLeftAndRight();
  postscript_name = buffer;
  if (nullptr == postscript_name || 0 == postscript_name[0])
    return &ON_Font::Default;

  const ON_Font* managed_font = ON_Font::ManagedFontList().FromPostScriptName(postscript_name);
  if (nullptr != managed_font)
    return managed_font;

  const ON_Font* installed_font = ON_Font::InstalledFontList().FromPostScriptName(postscript_name);
  if (nullptr != installed_font)
    return installed_font->ManagedFont();

  // This font is not installed.
  ON_Font font(ON_Font::Unset);

  // preferred weight/stretch/style since this font is not installed
  font.SetFontWeight(ON_Font::Weight::Normal);
  font.SetFontStretch(ON_Font::Stretch::Medium);
  font.SetFontStyle(ON_Font::Style::Upright);
  font.m_loc_postscript_name = postscript_name;
  font.m_en_postscript_name = font.m_loc_postscript_name;

  return font.ManagedFont();
}